

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessProgramPipelinesTests.cpp
# Opt level: O0

void __thiscall
gl4cts::DirectStateAccess::ProgramPipelines::FunctionalTest::clean(FunctionalTest *this)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  Functions *gl;
  FunctionalTest *this_local;
  long lVar3;
  
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  if (this->m_fbo != 0) {
    (**(code **)(lVar3 + 0x440))(1,&this->m_fbo);
    this->m_fbo = 0;
  }
  if (this->m_rbo != 0) {
    (**(code **)(lVar3 + 0x460))(1,&this->m_rbo);
    this->m_rbo = 0;
  }
  if (this->m_vao != 0) {
    (**(code **)(lVar3 + 0x490))(1,&this->m_vao);
    this->m_vao = 0;
  }
  if (this->m_spo_v != 0) {
    (**(code **)(lVar3 + 0x448))(this->m_spo_v);
    this->m_spo_v = 0;
  }
  if (this->m_spo_f != 0) {
    (**(code **)(lVar3 + 0x448))(this->m_spo_f);
    this->m_spo_f = 0;
  }
  if (this->m_ppo != 0) {
    (**(code **)(lVar3 + 0x98))(0);
    (**(code **)(lVar3 + 0x450))(1,&this->m_ppo);
    this->m_ppo = 0;
  }
  return;
}

Assistant:

void FunctionalTest::clean()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Release framebuffer. */
	if (m_fbo)
	{
		gl.deleteFramebuffers(1, &m_fbo);

		m_fbo = 0;
	}

	/* Release renderbuffer. */
	if (m_rbo)
	{
		gl.deleteRenderbuffers(1, &m_rbo);

		m_rbo = 0;
	}

	/* Release vertex array object. */
	if (m_vao)
	{
		gl.deleteVertexArrays(1, &m_vao);

		m_vao = 0;
	}

	/* Release shader programs. */
	if (m_spo_v)
	{
		gl.deleteProgram(m_spo_v);

		m_spo_v = 0;
	}

	if (m_spo_f)
	{
		gl.deleteProgram(m_spo_f);

		m_spo_f = 0;
	}

	/* Release program pipelines. */
	if (m_ppo)
	{
		gl.bindProgramPipeline(0);

		gl.deleteProgramPipelines(1, &m_ppo);

		m_ppo = 0;
	}
}